

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O3

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,exception exception)

{
  undefined1 *puVar1;
  size_t *psVar2;
  printer *ppVar3;
  char *local_28;
  
  puVar1 = &(this->printer_).field_0x40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n  ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->printer_).colors_.fail._M_str,
             (this->printer_).colors_.fail._M_len);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"Unexpected exception with message:\n",0x23);
  local_28 = exception.msg;
  ppVar3 = printer::operator<<(&this->printer_,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ppVar3->field_0x40,(this->printer_).colors_.none._M_str,
             (this->printer_).colors_.none._M_len);
  psVar2 = &(this->asserts_).fail;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

auto on(events::exception exception) -> void {
      printer_ << "\n  " << printer_.colors().fail
               << "Unexpected exception with message:\n"
               << exception.what() << printer_.colors().none;
      ++asserts_.fail;
    }